

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  pointer pcVar1;
  bool bVar2;
  string *ts_1;
  string local_40;
  
  if (*(expr->_M_dataplus)._M_p == '&') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)expr);
  }
  else if ((this->backend).native_pointers == true) {
    local_40._M_dataplus._M_p._0_1_ = 0x2a;
    join<char,std::__cxx11::string_const&>
              (__return_storage_ptr__,(spirv_cross *)&local_40,(char *)expr,expr);
  }
  else {
    ts_1 = expr;
    bVar2 = Compiler::is_physical_pointer(&this->super_Compiler,expr_type);
    if ((bVar2) &&
       (bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,expr_type),
       !bVar2)) {
      enclose_expression(&local_40,(CompilerGLSL *)expr_type,expr);
      join<std::__cxx11::string,char_const(&)[7]>
                (__return_storage_ptr__,(spirv_cross *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".value",
                 (char (*) [7])ts_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) ==
          &local_40.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (expr->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + expr->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (is_physical_pointer(expr_type) && !is_physical_pointer_to_buffer_block(expr_type))
		return join(enclose_expression(expr), ".value");
	else
		return expr;
}